

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int WebPPictureHasTransparency(WebPPicture *picture)

{
  int *in_RDI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == (int *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (int)((ulong)in_RDI >> 0x20);
    if (*in_RDI == 0) {
      iVar1 = CheckNonOpaque((uint8_t *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),iVar1,
                             (int)in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    }
    else if (*(long *)(in_RDI + 0x12) == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = CheckNonOpaque((uint8_t *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),iVar1,
                             (int)in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    }
  }
  return iVar1;
}

Assistant:

int WebPPictureHasTransparency(const WebPPicture* picture) {
  if (picture == NULL) return 0;
  if (picture->use_argb) {
    if (picture->argb != NULL) {
      return CheckNonOpaque((const uint8_t*)picture->argb + ALPHA_OFFSET,
                            picture->width, picture->height,
                            4, picture->argb_stride * sizeof(*picture->argb));
    }
    return 0;
  }
  return CheckNonOpaque(picture->a, picture->width, picture->height,
                        1, picture->a_stride);
}